

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::Array2D<pbrt::GBufferFilm::Pixel>::Array2D
          (Array2D<pbrt::GBufferFilm::Pixel> *this,Bounds2i *extent,allocator_type allocator)

{
  Pixel *pPVar1;
  undefined1 auVar2 [64];
  Pixel *pPVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  
  TVar4 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
       (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar4;
  (this->allocator).memoryResource = allocator.memoryResource;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  auVar13 = vpsubd_avx(auVar11,auVar13);
  auVar11 = vpshufd_avx(auVar13,0x55);
  auVar11 = vpmulld_avx(auVar11,auVar13);
  uVar10 = auVar11._0_4_;
  iVar5 = (*(allocator.memoryResource)->_vptr_memory_resource[2])
                    (allocator.memoryResource,(long)(int)uVar10 * 0xb0,8);
  this->values = (Pixel *)CONCAT44(extraout_var,iVar5);
  if (0 < (int)uVar10) {
    lVar6 = 0x20;
    auVar12 = ZEXT1664((undefined1  [16])0x0);
    uVar7 = 0;
    do {
      pPVar3 = this->values;
      auVar2 = vmovdqu64_avx512f(auVar12);
      *(undefined1 (*) [64])(pPVar3[uVar7].albedoSum + 1) = auVar2;
      auVar2 = vmovdqu64_avx512f(auVar12);
      *(undefined1 (*) [64])&pPVar3[uVar7].pSum.super_Tuple3<pbrt::Point3,_float>.z = auVar2;
      pPVar1 = pPVar3 + uVar7;
      auVar2 = vmovdqu64_avx512f(auVar12);
      pPVar1->rgbSum[0] = (double)auVar2._0_8_;
      pPVar1->rgbSum[1] = (double)auVar2._8_8_;
      pPVar1->rgbSum[2] = (double)auVar2._16_8_;
      pPVar1->weightSum = (double)auVar2._24_8_;
      pPVar1->splatRGB[0] = (AtomicDouble)auVar2._32_8_;
      pPVar1->splatRGB[1] = (AtomicDouble)auVar2._40_8_;
      pPVar1->splatRGB[2] = (AtomicDouble)auVar2._48_8_;
      (pPVar1->pSum).super_Tuple3<pbrt::Point3,_float>.x = (float)auVar2._56_4_;
      (pPVar1->pSum).super_Tuple3<pbrt::Point3,_float>.y = (float)auVar2._60_4_;
      lVar9 = -0x18;
      do {
        LOCK();
        *(undefined8 *)((long)(pPVar3->splatRGB + -1) + lVar9 + lVar6) = 0;
        UNLOCK();
        lVar9 = lVar9 + 8;
      } while (lVar9 != 0);
      uVar8 = uVar7 + 1;
      lVar6 = lVar6 + 0xb0;
      pPVar3[uVar7].dzdxSum = 0.0;
      pPVar3[uVar7].dzdySum = 0.0;
      pPVar3[uVar7].nSum.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
      pPVar3[uVar7].nSum.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
      *(undefined8 *)&pPVar3[uVar7].nSum.super_Tuple3<pbrt::Normal3,_float>.z = 0;
      pPVar3[uVar7].nsSum.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
      pPVar3[uVar7].nsSum.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
      pPVar3[uVar7].pSum.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
      pPVar3[uVar7].pSum.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
      *(undefined8 *)&pPVar3[uVar7].pSum.super_Tuple3<pbrt::Point3,_float>.z = 0;
      pPVar3[uVar7].dzdySum = 0.0;
      pPVar3[uVar7].nSum.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
      pPVar3[uVar7].nSum.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
      pPVar3[uVar7].nSum.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
      pPVar1 = pPVar3 + uVar7;
      auVar2 = vmovdqu64_avx512f(auVar12);
      auVar11 = auVar2._24_16_;
      auVar13 = auVar2._40_16_;
      pPVar1->albedoSum[0] = (double)auVar2._0_8_;
      pPVar1->albedoSum[1] = (double)auVar2._8_8_;
      pPVar1->albedoSum[2] = (double)auVar2._16_8_;
      pPVar1->varianceEstimator[0].mean = (float)auVar11._0_4_;
      pPVar1->varianceEstimator[0].S = (float)auVar11._4_4_;
      pPVar1->varianceEstimator[0].n = auVar11._8_8_;
      pPVar1->varianceEstimator[1].mean = (float)auVar13._0_4_;
      pPVar1->varianceEstimator[1].S = (float)auVar13._4_4_;
      pPVar1->varianceEstimator[1].n = auVar13._8_8_;
      pPVar1->varianceEstimator[2].mean = (float)auVar2._56_4_;
      pPVar1->varianceEstimator[2].S = (float)auVar2._60_4_;
      pPVar3[uVar7].varianceEstimator[2].n = 0;
      uVar7 = uVar8;
    } while (uVar8 != uVar10);
  }
  return;
}

Assistant:

Array2D(const Bounds2i &extent, allocator_type allocator = {})
        : extent(extent), allocator(allocator) {
        int n = extent.Area();
        values = allocator.allocate_object<T>(n);
        for (int i = 0; i < n; ++i)
            allocator.construct(values + i);
    }